

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<bool,pstore::command_line::parser<bool,void>>&,char_const(&)[19],pstore::command_line::desc_const&,pstore::command_line::details::initializer<bool>const&>
               (opt<bool,_pstore::command_line::parser<bool,_void>_> *opt,char (*m0) [19],desc *mods
               ,initializer<bool> *mods_1)

{
  name local_48;
  initializer<bool> *local_28;
  initializer<bool> *mods_local_1;
  desc *mods_local;
  char (*m0_local) [19];
  opt<bool,_pstore::command_line::parser<bool,_void>_> *opt_local;
  
  local_28 = mods_1;
  mods_local_1 = (initializer<bool> *)mods;
  mods_local = (desc *)m0;
  m0_local = (char (*) [19])opt;
  make_modifier(&local_48,*m0);
  name::apply<pstore::command_line::opt<bool,pstore::command_line::parser<bool,void>>>
            (&local_48,(opt<bool,_pstore::command_line::parser<bool,_void>_> *)m0_local);
  name::~name(&local_48);
  apply_to_option<pstore::command_line::opt<bool,pstore::command_line::parser<bool,void>>&,pstore::command_line::desc_const&,pstore::command_line::details::initializer<bool>const&>
            ((opt<bool,_pstore::command_line::parser<bool,_void>_> *)m0_local,(desc *)mods_local_1,
             local_28);
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }